

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall Catch::Optional<Catch::AssertionStats>::reset(Optional<Catch::AssertionStats> *this)

{
  AssertionStats *pAVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pAVar1 = this->nullableValue;
  if (pAVar1 != (AssertionStats *)0x0) {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
              (&pAVar1->infoMessages);
    pcVar2 = (pAVar1->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
    paVar3 = &(pAVar1->assertionResult).m_resultData.reconstructedExpression.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
    pcVar2 = (pAVar1->assertionResult).m_resultData.message._M_dataplus._M_p;
    paVar3 = &(pAVar1->assertionResult).m_resultData.message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar3) {
      operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    }
  }
  this->nullableValue = (AssertionStats *)0x0;
  return;
}

Assistant:

void reset() {
            if ( nullableValue ) { nullableValue->~T(); }
            nullableValue = nullptr;
        }